

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapBase.h
# Opt level: O1

bool __thiscall
Eigen::RefBase<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>>::
construct<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<_1,0>>>
          (RefBase<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>> *this,
          Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<_1,_0>_> *expr)

{
  PointerType pdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  pdVar1 = (expr->
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<_1,_0>_>,_1>
           ).
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<_1,_0>_>,_0>
           .m_data;
  uVar2 = (expr->
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<_1,_0>_>,_1>
          ).
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<_1,_0>_>,_0>
          .m_rows.m_value;
  uVar3 = (expr->
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<_1,_0>_>,_1>
          ).
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<_1,_0>_>,_0>
          .m_cols.m_value;
  uVar4 = (expr->m_stride).m_outer.m_value;
  *(PointerType *)this = pdVar1;
  *(ulong *)(this + 8) = uVar2;
  *(ulong *)(this + 0x10) = uVar3;
  if (-1 < (long)(uVar3 | uVar2) || pdVar1 == (PointerType)0x0) {
    if (uVar4 == 0) {
      uVar4 = uVar2;
    }
    if (uVar3 == 1) {
      uVar4 = uVar2;
    }
    *(ulong *)(this + 0x18) = uVar4;
    return true;
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                ,0xb2,
                "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1>>, Level = 0]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
    inline ScalarWithConstIfNotLvalue* data() { return this->m_data; }